

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O0

string * tinyusdz::to_lower(string *__return_storage_ptr__,string *str)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string *str_local;
  string *result;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  uVar1 = ::std::__cxx11::string::begin();
  uVar2 = ::std::__cxx11::string::end();
  uVar3 = ::std::__cxx11::string::begin();
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,tinyusdz::to_lower(std::__cxx11::string_const&)::_lambda(unsigned_char)_1_>
            (uVar1,uVar2,uVar3);
  return __return_storage_ptr__;
}

Assistant:

inline const std::string to_lower(const std::string &str) {
  std::string result = str;
  std::transform(result.begin(), result.end(), result.begin(), [](unsigned char c) {
    if ((c >= 'A') && (c <= 'Z')) {
      c += 32;
    }
    return static_cast<char>(c);
  });
  return result;
}